

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PagerSetFlags(Pager *pPager,uint pgFlags)

{
  uint uVar1;
  uint level;
  uint pgFlags_local;
  Pager *pPager_local;
  
  uVar1 = pgFlags & 7;
  if (pPager->tempFile == '\0') {
    pPager->noSync = uVar1 == 1;
    pPager->fullSync = 2 < uVar1;
    pPager->extraSync = uVar1 == 4;
  }
  else {
    pPager->noSync = '\x01';
    pPager->fullSync = '\0';
    pPager->extraSync = '\0';
  }
  if (pPager->noSync == '\0') {
    if ((pgFlags & 8) == 0) {
      pPager->syncFlags = '\x02';
    }
    else {
      pPager->syncFlags = '\x03';
    }
  }
  else {
    pPager->syncFlags = '\0';
  }
  pPager->walSyncFlags = pPager->syncFlags << 2;
  if (pPager->fullSync != '\0') {
    pPager->walSyncFlags = pPager->walSyncFlags | pPager->syncFlags;
  }
  if (((pgFlags & 0x10) != 0) && (pPager->noSync == '\0')) {
    pPager->walSyncFlags = pPager->walSyncFlags | 0xc;
  }
  if ((pgFlags & 0x20) == 0) {
    pPager->doNotSpill = pPager->doNotSpill | 1;
  }
  else {
    pPager->doNotSpill = pPager->doNotSpill & 0xfe;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerSetFlags(
  Pager *pPager,        /* The pager to set safety level for */
  unsigned pgFlags      /* Various flags */
){
  unsigned level = pgFlags & PAGER_SYNCHRONOUS_MASK;
  if( pPager->tempFile ){
    pPager->noSync = 1;
    pPager->fullSync = 0;
    pPager->extraSync = 0;
  }else{
    pPager->noSync =  level==PAGER_SYNCHRONOUS_OFF ?1:0;
    pPager->fullSync = level>=PAGER_SYNCHRONOUS_FULL ?1:0;
    pPager->extraSync = level==PAGER_SYNCHRONOUS_EXTRA ?1:0;
  }
  if( pPager->noSync ){
    pPager->syncFlags = 0;
  }else if( pgFlags & PAGER_FULLFSYNC ){
    pPager->syncFlags = SQLITE_SYNC_FULL;
  }else{
    pPager->syncFlags = SQLITE_SYNC_NORMAL;
  }
  pPager->walSyncFlags = (pPager->syncFlags<<2);
  if( pPager->fullSync ){
    pPager->walSyncFlags |= pPager->syncFlags;
  }
  if( (pgFlags & PAGER_CKPT_FULLFSYNC) && !pPager->noSync ){
    pPager->walSyncFlags |= (SQLITE_SYNC_FULL<<2);
  }
  if( pgFlags & PAGER_CACHESPILL ){
    pPager->doNotSpill &= ~SPILLFLAG_OFF;
  }else{
    pPager->doNotSpill |= SPILLFLAG_OFF;
  }
}